

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

HaltonSampler *
pbrt::HaltonSampler::Create
          (ParameterDictionary *parameters,Point2i *fullResolution,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  HaltonSampler *pHVar4;
  RandomizeStrategy randomizer;
  int nsamp;
  allocator<char> local_9a;
  allocator<char> local_99;
  string s;
  int seed;
  Allocator alloc_local;
  string local_68;
  string local_48;
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"pixelsamples",(allocator<char> *)&local_68);
  iVar2 = ParameterDictionary::GetOneInt(parameters,&s,0x10);
  std::__cxx11::string::~string((string *)&s);
  nsamp = iVar2;
  if ((char)Options[8] == '\x01') {
    piVar3 = pstd::optional<int>::value((optional<int> *)(Options + 7));
    nsamp = *piVar3;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"seed",(allocator<char> *)&local_68);
  iVar2 = ParameterDictionary::GetOneInt(parameters,&s,*Options);
  std::__cxx11::string::~string((string *)&s);
  if ((char)Options[0xb] == '\x01') {
    nsamp = 1;
  }
  seed = iVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"randomization",&local_99);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"permutedigits",&local_9a);
  ParameterDictionary::GetOneString(&s,parameters,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  bVar1 = std::operator==(&s,"none");
  if (bVar1) {
    randomizer = None;
  }
  else {
    bVar1 = std::operator==(&s,"cranleypatterson");
    if (bVar1) {
      randomizer = CranleyPatterson;
    }
    else {
      bVar1 = std::operator==(&s,"permutedigits");
      if (bVar1) {
        randomizer = PermuteDigits;
      }
      else {
        bVar1 = std::operator==(&s,"fastowen");
        if (bVar1) {
          ErrorExit<>("%s: \"fastowen\" randomization not supported by Halton sampler.");
        }
        bVar1 = std::operator==(&s,"owen");
        if (!bVar1) {
          ErrorExit<std::__cxx11::string&>
                    (loc,"%s: unknown randomization strategy given to PaddedSobolSampler",&s);
        }
        randomizer = Owen;
      }
    }
  }
  pHVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::HaltonSampler,int&,pbrt::Point2<int>const&,pbrt::RandomizeStrategy&,int&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,&nsamp,fullResolution,&randomizer,&seed,&alloc_local);
  std::__cxx11::string::~string((string *)&s);
  return pHVar4;
}

Assistant:

HaltonSampler *HaltonSampler::Create(const ParameterDictionary &parameters,
                                     const Point2i &fullResolution, const FileLoc *loc,
                                     Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    int seed = parameters.GetOneInt("seed", Options->seed);
    if (Options->quickRender)
        nsamp = 1;

    RandomizeStrategy randomizer;
    std::string s = parameters.GetOneString("randomization", "permutedigits");
    if (s == "none")
        randomizer = RandomizeStrategy::None;
    else if (s == "cranleypatterson")
        randomizer = RandomizeStrategy::CranleyPatterson;
    else if (s == "permutedigits")
        randomizer = RandomizeStrategy::PermuteDigits;
    else if (s == "fastowen")
        ErrorExit("%s: \"fastowen\" randomization not supported by Halton sampler.");
    else if (s == "owen")
        randomizer = RandomizeStrategy::Owen;
    else
        ErrorExit(loc, "%s: unknown randomization strategy given to PaddedSobolSampler",
                  s);

    return alloc.new_object<HaltonSampler>(nsamp, fullResolution, randomizer, seed,
                                           alloc);
}